

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

bool __thiscall QJsonPrivate::Parser::parseValueIntoContainer(Parser *this)

{
  QCborContainerPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  parseValue((QCborValue *)local_38,this);
  if (local_38._16_4_ != String) {
    if (local_38._16_4_ == Undefined) {
      bVar1 = false;
      goto LAB_002f9127;
    }
    this_00 = (this->container).d.ptr;
    QCborContainerPrivate::insertAt
              (this_00,(this_00->elements).d.size,(QCborValue *)local_38,MoveContainer);
    local_38._8_8_ = (QCborContainerPrivate *)0x0;
    local_38._16_4_ = 0x117;
  }
  bVar1 = true;
LAB_002f9127:
  QCborValue::~QCborValue((QCborValue *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseValueIntoContainer()
{
    QCborValue value = parseValue();
    switch (value.type()) {
    case QCborValue::Undefined:
        return false; // error while parsing
    case QCborValue::String:
        break; // strings were already added
    default:
        container->append(std::move(value));
    }

    return true;
}